

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isMipmapLinearSampleResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               FilterMode levelFilter,LookupPrecision *prec,float coordX,int coordY,Vec2 *fBounds,
               Vec4 *result)

{
  int coordY_local;
  float coordX_local;
  LookupPrecision *prec_local;
  FilterMode levelFilter_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level1_local;
  ConstPixelBufferAccess *level0_local;
  
  if (levelFilter == LINEAR) {
    level0_local._7_1_ =
         isLinearMipmapLinearSampleResultValid
                   (level0,level1,sampler,prec,coordX,coordY,fBounds,result);
  }
  else {
    level0_local._7_1_ =
         isNearestMipmapLinearSampleResultValid
                   (level0,level1,sampler,prec,coordX,coordY,fBounds,result);
  }
  return level0_local._7_1_;
}

Assistant:

static bool isMipmapLinearSampleResultValid (const ConstPixelBufferAccess&		level0,
										     const ConstPixelBufferAccess&		level1,
											 const Sampler&						sampler,
										     const Sampler::FilterMode			levelFilter,
										     const LookupPrecision&				prec,
										     const float						coordX,
											 const int							coordY,
										     const Vec2&						fBounds,
										     const Vec4&						result)
{
	if (levelFilter == Sampler::LINEAR)
		return isLinearMipmapLinearSampleResultValid(level0, level1, sampler, prec, coordX, coordY, fBounds, result);
	else
		return isNearestMipmapLinearSampleResultValid(level0, level1, sampler, prec, coordX, coordY, fBounds, result);
}